

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDerivateTests.cpp
# Opt level: O3

void __thiscall
vkt::sr::anon_unknown_0::LinearDerivateCase::initPrograms
          (LinearDerivateCase *this,SourceCollections *programCollection)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  SurfaceType SVar9;
  DerivateFunc DVar10;
  DerivateCaseValues *pDVar11;
  SourceCollections *this_00;
  char *pcVar12;
  mapped_type *pmVar13;
  ulong uVar14;
  ProgramSources *pPVar15;
  DataType DVar16;
  Precision PVar17;
  char *pcVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fragmentParams;
  string fragmentSrc;
  undefined1 local_f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  string local_c8;
  SourceCollections *local_a8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a0;
  string local_70;
  string local_50;
  
  SVar9 = (this->super_TriangleDerivateCase).m_definitions.surfaceType;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a0._M_impl.super__Rb_tree_header._M_header;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a0._M_impl.super__Rb_tree_header._M_node_count = 0;
  DVar16 = TYPE_FLOAT_VEC4;
  if (SVar9 == SURFACETYPE_FLOAT_FBO) {
    DVar16 = TYPE_UINT_VEC4;
  }
  local_a8 = programCollection;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a0._M_impl.super__Rb_tree_header._M_header._M_left;
  pcVar12 = glu::getDataTypeName(DVar16);
  local_f0._0_8_ = &local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"OUTPUT_TYPE","");
  pmVar13 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_a0,(key_type *)local_f0);
  pcVar18 = (char *)pmVar13->_M_string_length;
  strlen(pcVar12);
  std::__cxx11::string::_M_replace((ulong)pmVar13,0,pcVar18,(ulong)pcVar12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._0_8_ != &local_e0) {
    operator_delete((void *)local_f0._0_8_,local_e0._M_allocated_capacity + 1);
  }
  PVar17 = PRECISION_HIGHP;
  if (SVar9 != SURFACETYPE_FLOAT_FBO) {
    PVar17 = (this->super_TriangleDerivateCase).m_definitions.precision;
  }
  pcVar12 = glu::getPrecisionName(PVar17);
  local_f0._0_8_ = &local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"OUTPUT_PREC","");
  pmVar13 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_a0,(key_type *)local_f0);
  pcVar18 = (char *)pmVar13->_M_string_length;
  strlen(pcVar12);
  std::__cxx11::string::_M_replace((ulong)pmVar13,0,pcVar18,(ulong)pcVar12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._0_8_ != &local_e0) {
    operator_delete((void *)local_f0._0_8_,local_e0._M_allocated_capacity + 1);
  }
  pcVar12 = glu::getPrecisionName((this->super_TriangleDerivateCase).m_definitions.precision);
  local_f0._0_8_ = &local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"PRECISION","");
  pmVar13 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_a0,(key_type *)local_f0);
  pcVar18 = (char *)pmVar13->_M_string_length;
  strlen(pcVar12);
  std::__cxx11::string::_M_replace((ulong)pmVar13,0,pcVar18,(ulong)pcVar12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._0_8_ != &local_e0) {
    operator_delete((void *)local_f0._0_8_,local_e0._M_allocated_capacity + 1);
  }
  pcVar12 = glu::getDataTypeName((this->super_TriangleDerivateCase).m_definitions.dataType);
  local_f0._0_8_ = &local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"DATATYPE","");
  pmVar13 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_a0,(key_type *)local_f0);
  pcVar18 = (char *)pmVar13->_M_string_length;
  strlen(pcVar12);
  std::__cxx11::string::_M_replace((ulong)pmVar13,0,pcVar18,(ulong)pcVar12);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._0_8_ != &local_e0) {
    operator_delete((void *)local_f0._0_8_,local_e0._M_allocated_capacity + 1);
  }
  uVar14 = (ulong)(this->super_TriangleDerivateCase).m_definitions.func;
  if (uVar14 < 9) {
    pcVar18 = (&PTR_anon_var_dwarf_adc6bc_00cf68c8)[uVar14];
  }
  else {
    pcVar18 = (char *)0x0;
  }
  local_f0._0_8_ = &local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"FUNC","");
  pmVar13 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_a0,(key_type *)local_f0);
  pcVar12 = (char *)pmVar13->_M_string_length;
  strlen(pcVar18);
  std::__cxx11::string::_M_replace((ulong)pmVar13,0,pcVar12,(ulong)pcVar18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._0_8_ != &local_e0) {
    operator_delete((void *)local_f0._0_8_,local_e0._M_allocated_capacity + 1);
  }
  this_00 = local_a8;
  DVar16 = (this->super_TriangleDerivateCase).m_definitions.dataType;
  if (SVar9 == SURFACETYPE_FLOAT_FBO) {
    if (DVar16 == TYPE_FLOAT_VEC3) {
      pcVar18 = "floatBitsToUint(vec4(res, 1.0))";
    }
    else if (DVar16 == TYPE_FLOAT_VEC4) {
      pcVar18 = "floatBitsToUint(res)";
    }
    else {
      pcVar18 = "floatBitsToUint(vec4(res, 0.0, 0.0, 1.0))";
      if (DVar16 == TYPE_FLOAT_VEC2) {
        pcVar18 = "floatBitsToUint(vec4(res, 0.0, 1.0))";
      }
    }
    local_f0._0_8_ = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"CAST_TO_OUTPUT","");
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_a0,(key_type *)local_f0);
    pcVar12 = (char *)pmVar13->_M_string_length;
    strlen(pcVar18);
    std::__cxx11::string::_M_replace((ulong)pmVar13,0,pcVar12,(ulong)pcVar18);
    PVar17 = (Precision)pcVar18;
  }
  else {
    if (DVar16 == TYPE_FLOAT_VEC3) {
      pcVar18 = "vec4(res, 1.0)";
    }
    else if (DVar16 == TYPE_FLOAT_VEC4) {
      pcVar18 = "res";
    }
    else {
      pcVar18 = "vec4(res, 0.0, 0.0, 1.0)";
      if (DVar16 == TYPE_FLOAT_VEC2) {
        pcVar18 = "vec4(res, 0.0, 1.0)";
      }
    }
    local_f0._0_8_ = &local_e0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"CAST_TO_OUTPUT","");
    pmVar13 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&local_a0,(key_type *)local_f0);
    pcVar12 = (char *)pmVar13->_M_string_length;
    strlen(pcVar18);
    std::__cxx11::string::_M_replace((ulong)pmVar13,0,pcVar12,(ulong)pcVar18);
    PVar17 = (Precision)pcVar18;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._0_8_ != &local_e0) {
    operator_delete((void *)local_f0._0_8_,local_e0._M_allocated_capacity + 1);
  }
  tcu::StringTemplate::StringTemplate((StringTemplate *)local_f0,&this->m_fragmentTmpl);
  tcu::StringTemplate::specialize
            (&local_50,(StringTemplate *)local_f0,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_a0);
  tcu::StringTemplate::~StringTemplate((StringTemplate *)local_f0);
  paVar1 = &local_c8.field_2;
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"vert","");
  pPVar15 = ::vk::ProgramCollection<glu::ProgramSources>::add(&this_00->glslSources,&local_c8);
  sr::(anonymous_namespace)::genVertexSource_abi_cxx11_
            (&local_70,
             (_anonymous_namespace_ *)
             (ulong)(this->super_TriangleDerivateCase).m_definitions.coordDataType,
             (this->super_TriangleDerivateCase).m_definitions.coordPrecision,PVar17);
  local_f0._0_8_ = local_f0._0_8_ & 0xffffffff00000000;
  pcVar18 = local_e0._M_local_buf + 8;
  local_f0._8_8_ = pcVar18;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_f0 + 8),local_70._M_dataplus._M_p,
             local_70._M_dataplus._M_p + local_70._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar15->sources + (local_f0._0_8_ & 0xffffffff),(value_type *)(local_f0 + 8));
  if ((char *)local_f0._8_8_ != pcVar18) {
    operator_delete((void *)local_f0._8_8_,local_e0._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  local_c8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"frag","");
  pPVar15 = ::vk::ProgramCollection<glu::ProgramSources>::add(&this_00->glslSources,&local_c8);
  local_f0._0_4_ = 1;
  local_f0._8_8_ = pcVar18;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_f0 + 8),local_50._M_dataplus._M_p,
             local_50._M_dataplus._M_p + local_50._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar15->sources + (local_f0._0_8_ & 0xffffffff),(value_type *)(local_f0 + 8));
  if ((char *)local_f0._8_8_ != pcVar18) {
    operator_delete((void *)local_f0._8_8_,local_e0._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != paVar1) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  uVar14 = (ulong)(this->super_TriangleDerivateCase).m_definitions.precision;
  if (uVar14 < 3) {
    fVar2 = *(float *)(&DAT_00aeaf84 + uVar14 * 4);
    fVar3 = *(float *)(&DAT_00aeaf90 + uVar14 * 4);
    fVar4 = *(float *)(&DAT_00aeaf9c + uVar14 * 4);
    fVar5 = *(float *)(&DAT_00aeafa8 + uVar14 * 4);
    fVar6 = *(float *)(&DAT_00aeafb4 + uVar14 * 4);
    fVar7 = *(float *)(&DAT_00aeafc0 + uVar14 * 4);
    fVar8 = *(float *)(&DAT_00aeafcc + uVar14 * 4);
    (this->super_TriangleDerivateCase).m_values.coordMin.m_data[0] =
         *(float *)(&DAT_00aeaf78 + uVar14 * 4);
    (this->super_TriangleDerivateCase).m_values.coordMin.m_data[1] = fVar2;
    (this->super_TriangleDerivateCase).m_values.coordMin.m_data[2] = fVar3;
    (this->super_TriangleDerivateCase).m_values.coordMin.m_data[3] = fVar4;
    (this->super_TriangleDerivateCase).m_values.coordMax.m_data[0] = fVar5;
    (this->super_TriangleDerivateCase).m_values.coordMax.m_data[1] = fVar6;
    (this->super_TriangleDerivateCase).m_values.coordMax.m_data[2] = fVar7;
    (this->super_TriangleDerivateCase).m_values.coordMax.m_data[3] = fVar8;
  }
  auVar19 = _DAT_00aa8f70;
  if ((this->super_TriangleDerivateCase).m_definitions.surfaceType != SURFACETYPE_FLOAT_FBO) {
    auVar19._0_8_ =
         CONCAT44((this->super_TriangleDerivateCase).m_values.coordMax.m_data[1] -
                  (this->super_TriangleDerivateCase).m_values.coordMin.m_data[1],
                  (this->super_TriangleDerivateCase).m_values.coordMax.m_data[0] -
                  (this->super_TriangleDerivateCase).m_values.coordMin.m_data[0]);
    auVar19._8_4_ =
         (this->super_TriangleDerivateCase).m_values.coordMax.m_data[2] -
         (this->super_TriangleDerivateCase).m_values.coordMin.m_data[2];
    auVar19._12_4_ =
         (this->super_TriangleDerivateCase).m_values.coordMax.m_data[3] -
         (this->super_TriangleDerivateCase).m_values.coordMin.m_data[3];
    auVar20._8_4_ = auVar19._8_4_;
    auVar20._0_8_ = auVar19._0_8_;
    auVar20._12_4_ = auVar19._12_4_;
    auVar20 = divps(auVar20,_DAT_00aeabc0);
    DVar10 = (this->super_TriangleDerivateCase).m_definitions.func;
    if (DVar10 < DERIVATE_DFDY) {
      auVar19 = divps(_DAT_00ab0da0,auVar20);
    }
    else {
      auVar19 = divps(auVar19,_DAT_00aeabd0);
      if (DVar10 - DERIVATE_DFDY < 3) {
        auVar19 = divps(_DAT_00ab0da0,auVar19);
        *(undefined1 (*) [16])(this->super_TriangleDerivateCase).m_values.derivScale.m_data =
             auVar19;
        goto LAB_0056dd52;
      }
      if (2 < DVar10 - DERIVATE_FWIDTH) goto LAB_0056dd52;
      auVar23._0_8_ = auVar20._0_8_ ^ 0x8000000080000000;
      auVar23._8_4_ = auVar20._8_4_ ^ 0x80000000;
      auVar23._12_4_ = auVar20._12_4_ ^ 0x80000000;
      auVar20 = maxps(auVar23,auVar20);
      auVar21._0_8_ = auVar19._0_8_ ^ 0x8000000080000000;
      auVar21._8_4_ = auVar19._8_4_ ^ 0x80000000;
      auVar21._12_4_ = auVar19._12_4_ ^ 0x80000000;
      auVar19 = maxps(auVar21,auVar19);
      auVar22._0_4_ = auVar19._0_4_ + auVar20._0_4_;
      auVar22._4_4_ = auVar19._4_4_ + auVar20._4_4_;
      auVar22._8_4_ = auVar19._8_4_ + auVar20._8_4_;
      auVar22._12_4_ = auVar19._12_4_ + auVar20._12_4_;
      auVar19 = divps(_DAT_00ab0da0,auVar22);
    }
  }
  *(undefined1 (*) [16])(this->super_TriangleDerivateCase).m_values.derivScale.m_data = auVar19;
LAB_0056dd52:
  (this->super_TriangleDerivateCase).m_values.derivBias.m_data[0] = 0.0;
  (this->super_TriangleDerivateCase).m_values.derivBias.m_data[1] = 0.0;
  pDVar11 = &(this->super_TriangleDerivateCase).m_values;
  (pDVar11->derivBias).m_data[2] = 0.0;
  (pDVar11->derivBias).m_data[3] = 0.0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_a0);
  return;
}

Assistant:

void LinearDerivateCase::initPrograms (vk::SourceCollections& programCollection) const
{
	const tcu::UVec2	viewportSize	(VIEWPORT_WIDTH, VIEWPORT_HEIGHT);
	const float			w				= float(viewportSize.x());
	const float			h				= float(viewportSize.y());
	const bool			packToInt		= m_definitions.surfaceType == SURFACETYPE_FLOAT_FBO;
	map<string, string>	fragmentParams;

	fragmentParams["OUTPUT_TYPE"]		= glu::getDataTypeName(packToInt ? glu::TYPE_UINT_VEC4 : glu::TYPE_FLOAT_VEC4);
	fragmentParams["OUTPUT_PREC"]		= glu::getPrecisionName(packToInt ? glu::PRECISION_HIGHP : m_definitions.precision);
	fragmentParams["PRECISION"]			= glu::getPrecisionName(m_definitions.precision);
	fragmentParams["DATATYPE"]			= glu::getDataTypeName(m_definitions.dataType);
	fragmentParams["FUNC"]				= getDerivateFuncName(m_definitions.func);

	if (packToInt)
	{
		fragmentParams["CAST_TO_OUTPUT"]	= m_definitions.dataType == glu::TYPE_FLOAT_VEC4 ? "floatBitsToUint(res)" :
											  m_definitions.dataType == glu::TYPE_FLOAT_VEC3 ? "floatBitsToUint(vec4(res, 1.0))" :
											  m_definitions.dataType == glu::TYPE_FLOAT_VEC2 ? "floatBitsToUint(vec4(res, 0.0, 1.0))" :
											  /* TYPE_FLOAT */								   "floatBitsToUint(vec4(res, 0.0, 0.0, 1.0))";
	}
	else
	{
		fragmentParams["CAST_TO_OUTPUT"]	= m_definitions.dataType == glu::TYPE_FLOAT_VEC4 ? "res" :
											  m_definitions.dataType == glu::TYPE_FLOAT_VEC3 ? "vec4(res, 1.0)" :
											  m_definitions.dataType == glu::TYPE_FLOAT_VEC2 ? "vec4(res, 0.0, 1.0)" :
											  /* TYPE_FLOAT */								   "vec4(res, 0.0, 0.0, 1.0)";
	}

	std::string fragmentSrc = tcu::StringTemplate(m_fragmentTmpl).specialize(fragmentParams);
	programCollection.glslSources.add("vert") << glu::VertexSource(genVertexSource(m_definitions.coordDataType, m_definitions.coordPrecision));
	programCollection.glslSources.add("frag") << glu::FragmentSource(fragmentSrc);

	switch (m_definitions.precision)
	{
		case glu::PRECISION_HIGHP:
			m_values.coordMin = tcu::Vec4(-97.f, 0.2f, 71.f, 74.f);
			m_values.coordMax = tcu::Vec4(-13.2f, -77.f, 44.f, 76.f);
			break;

		case glu::PRECISION_MEDIUMP:
			m_values.coordMin = tcu::Vec4(-37.0f, 47.f, -7.f, 0.0f);
			m_values.coordMax = tcu::Vec4(-1.0f, 12.f, 7.f, 19.f);
			break;

		case glu::PRECISION_LOWP:
			m_values.coordMin = tcu::Vec4(0.0f, -1.0f, 0.0f, 1.0f);
			m_values.coordMax = tcu::Vec4(1.0f, 1.0f, -1.0f, -1.0f);
			break;

		default:
			DE_ASSERT(false);
	}

	if (m_definitions.surfaceType == SURFACETYPE_FLOAT_FBO)
	{
		// No scale or bias used for accuracy.
		m_values.derivScale	= tcu::Vec4(1.0f);
		m_values.derivBias		= tcu::Vec4(0.0f);
	}
	else
	{
		// Compute scale - bias that normalizes to 0..1 range.
		const tcu::Vec4 dx = (m_values.coordMax - m_values.coordMin) / tcu::Vec4(w, w, w*0.5f, -w*0.5f);
		const tcu::Vec4 dy = (m_values.coordMax - m_values.coordMin) / tcu::Vec4(h, h, h*0.5f, -h*0.5f);

		if (isDfdxFunc(m_definitions.func))
			m_values.derivScale = 0.5f / dx;
		else if (isDfdyFunc(m_definitions.func))
			m_values.derivScale = 0.5f / dy;
		else if (isFwidthFunc(m_definitions.func))
			m_values.derivScale = 0.5f / (tcu::abs(dx) + tcu::abs(dy));
		else
			DE_ASSERT(false);

		m_values.derivBias = tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f);
	}
}